

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O2

ActionMessage * __thiscall
helics::ipc::OwnedQueue::getMessage(ActionMessage *__return_storage_ptr__,OwnedQueue *this)

{
  ostream *poVar1;
  size_t rx_size;
  uint priority;
  size_type local_40;
  uint local_34;
  
  if (this->connected == false) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_error);
  }
  else {
    local_40 = 0;
    local_34 = 0;
    while( true ) {
      do {
        boost::interprocess::
        message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::receive
                  ((this->rqueue)._M_t.
                   super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                   .
                   super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
                   ._M_head_impl,
                   (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)this->mxSize,&local_40,&local_34);
      } while (local_40 < 8);
      ActionMessage::ActionMessage
                (__return_storage_ptr__,
                 (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,local_40);
      if (__return_storage_ptr__->messageAction != cmd_invalid) break;
      poVar1 = std::operator<<((ostream *)&std::cerr,"invalid command received ipc");
      std::endl<char,std::char_traits<char>>(poVar1);
      ActionMessage::~ActionMessage(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ActionMessage OwnedQueue::getMessage()
    {
        if (!connected) {
            return (CMD_ERROR);
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            rqueue->receive(buffer.data(), mxSize, rx_size, priority);
            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }